

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pigpiod_if2.c
# Opt level: O3

int intEventCallback(int pi,uint event,void *f,void *user,int ex)

{
  evtCallback_t **ppeVar1;
  evtCallback_t *peVar2;
  int iVar3;
  evtCallback_t *peVar4;
  
  peVar2 = geCallBackFirst;
  if (f == (void *)0x0 || 0x1f < event) {
    return -0x7d8;
  }
  peVar4 = geCallBackFirst;
  if (geCallBackFirst == (evtCallback_t *)0x0) {
    peVar4 = (evtCallback_t *)malloc(0x38);
    if (peVar4 == (evtCallback_t *)0x0) {
      return -0x7d7;
    }
  }
  else {
    do {
      if (((peVar4->pi == pi) && (peVar4->event == event)) && (peVar4->f == (CBF_t)f)) {
        return -0x7d6;
      }
      ppeVar1 = &peVar4->next;
      peVar4 = *ppeVar1;
    } while (*ppeVar1 != (evtCallback_t *)0x0);
    peVar4 = (evtCallback_t *)malloc(0x38);
    if (peVar4 == (evtCallback_t *)0x0) {
      return -0x7d7;
    }
    if (peVar2 != (evtCallback_t *)0x0) goto LAB_00107773;
  }
  geCallBackFirst = peVar4;
LAB_00107773:
  iVar3 = intEventCallback::id + 1;
  peVar4->id = intEventCallback::id;
  intEventCallback::id = iVar3;
  peVar4->pi = pi;
  peVar4->event = event;
  peVar4->f = (CBF_t)f;
  peVar4->user = user;
  peVar4->ex = ex;
  peVar4->next = (evtCallback_t *)0x0;
  peVar4->prev = geCallBackLast;
  if (geCallBackLast != (evtCallback_t *)0x0) {
    geCallBackLast->next = peVar4;
  }
  geCallBackLast = peVar4;
  findEventBits(pi);
  return peVar4->id;
}

Assistant:

static int intEventCallback(
   int pi, unsigned event, void *f, void *user, int ex)
{
   static int id = 0;
   evtCallback_t *ep;

   if ((event >=0) && (event < 32) && f)
   {
      /* prevent duplicates */

      ep = geCallBackFirst;

      while (ep)
      {
         if ((ep->pi    == pi)    &&
             (ep->event == event) &&
             (ep->f     == f))
         {
            return pigif_duplicate_callback;
         }
         ep = ep->next;
      }

      ep = malloc(sizeof(evtCallback_t));

      if (ep)
      {
         if (!geCallBackFirst) geCallBackFirst = ep;

         ep->id = id++;
         ep->pi = pi;
         ep->event = event;
         ep->f = f;
         ep->user = user;
         ep->ex = ex;
         ep->next = 0;
         ep->prev = geCallBackLast;

         if (ep->prev) (ep->prev)->next = ep;
         geCallBackLast = ep;

         findEventBits(pi);

         return ep->id;
      }

      return pigif_bad_malloc;
   }

   return pigif_bad_callback;
}